

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

void __thiscall FormatTest_FormatErrorCode_Test::TestBody(FormatTest_FormatErrorCode_Test *this)

{
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  size_t size;
  AssertionResult gtest_ar_2;
  string prefix_1;
  memory_buffer buffer_2;
  size_t n;
  size_t i;
  int codes [2];
  AssertionResult gtest_ar_1;
  string prefix;
  memory_buffer buffer_1;
  AssertionResult gtest_ar;
  memory_buffer buffer;
  string sep;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff618;
  undefined4 in_stack_fffffffffffff620;
  Type in_stack_fffffffffffff624;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff628;
  undefined7 in_stack_fffffffffffff630;
  undefined1 in_stack_fffffffffffff637;
  char *in_stack_fffffffffffff638;
  int line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff640;
  undefined4 in_stack_fffffffffffff648;
  Type in_stack_fffffffffffff64c;
  Type type;
  AssertHelper *in_stack_fffffffffffff650;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffff658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff660;
  allocator *paVar6;
  char *in_stack_fffffffffffff668;
  string *this_00;
  char *in_stack_fffffffffffff678;
  undefined7 in_stack_fffffffffffff680;
  undefined1 in_stack_fffffffffffff687;
  char *in_stack_fffffffffffff688;
  size_t in_stack_fffffffffffff690;
  Message *in_stack_fffffffffffff698;
  allocator *message_03;
  AssertHelper *in_stack_fffffffffffff6a0;
  AssertHelper *this_01;
  string local_918 [32];
  AssertionResult local_8f8 [3];
  char *local_8c8;
  AssertionResult local_8c0;
  undefined8 local_8b0;
  string local_898 [32];
  string local_878 [32];
  string local_858 [32];
  AssertionResult local_838 [2];
  allocator local_811;
  string local_810 [39];
  allocator<char> local_7e9;
  basic_buffer<char> local_7e8 [16];
  string local_5d0 [32];
  ulong local_5b0;
  ulong local_5a8;
  Type local_5a0 [6];
  string local_588 [32];
  AssertionResult local_568 [2];
  allocator local_541;
  string local_540 [39];
  AssertHelper local_519 [69];
  string local_2f0 [32];
  string local_2d0 [32];
  AssertionResult local_2b0 [2];
  basic_buffer<char> *local_290;
  allocator<char> local_281 [544];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"error 42",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,": ",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630),
             (allocator<char> *)in_stack_fffffffffffff628);
  std::allocator<char>::~allocator(local_281);
  local_290 = (basic_buffer<char> *)
              fmt::v5::format_to<char[8],,500ul,char>
                        (in_stack_fffffffffffff658,(char (*) [8])in_stack_fffffffffffff650);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
             (char *)in_stack_fffffffffffff618);
  message.size_ = in_stack_fffffffffffff690;
  message.data_ = in_stack_fffffffffffff688;
  fmt::v5::anon_unknown_10::format_error_code
            ((buffer *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
             (int)((ulong)in_stack_fffffffffffff678 >> 0x20),message);
  std::operator+(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
  fmt::v5::to_string<char,500ul>(in_stack_fffffffffffff658);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff638,
             (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630),
             in_stack_fffffffffffff628,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  std::__cxx11::string::~string(local_2f0);
  std::__cxx11::string::~string(local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff650);
    testing::AssertionResult::failure_message((AssertionResult *)0x112080);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff650,in_stack_fffffffffffff64c,(char *)in_stack_fffffffffffff640
               ,(int)((ulong)in_stack_fffffffffffff638 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630));
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
    testing::Message::~Message((Message *)0x1120e3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11213b);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  this_01 = local_519;
  std::allocator<char>::allocator();
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630),
             (allocator<char> *)in_stack_fffffffffffff628);
  std::allocator<char>::~allocator((allocator<char> *)local_519);
  pcVar3 = (char *)std::__cxx11::string::size();
  lVar4 = std::__cxx11::string::size();
  uVar5 = 0x1f5 - (long)(pcVar3 + lVar4);
  message_03 = &local_541;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,uVar5,'x',message_03);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
            ((basic_string_view<char> *)
             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),in_stack_fffffffffffff618
            );
  message_00.size_ = uVar5;
  message_00.data_ = pcVar3;
  fmt::v5::anon_unknown_10::format_error_code
            ((buffer *)CONCAT17(in_stack_fffffffffffff687,in_stack_fffffffffffff680),
             (int)((ulong)in_stack_fffffffffffff678 >> 0x20),message_00);
  fmt::v5::to_string<char,500ul>(in_stack_fffffffffffff658);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (in_stack_fffffffffffff638,
             (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630),
             in_stack_fffffffffffff628,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  std::__cxx11::string::~string(local_588);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_568);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffff650);
    in_stack_fffffffffffff678 =
         testing::AssertionResult::failure_message((AssertionResult *)0x112388);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff650,in_stack_fffffffffffff64c,(char *)in_stack_fffffffffffff640
               ,(int)((ulong)in_stack_fffffffffffff638 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630));
    testing::internal::AssertHelper::operator=(this_01,(Message *)message_03);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
    testing::Message::~Message((Message *)0x1123e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11243d);
  std::__cxx11::string::~string(local_540);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  local_5a0[0] = 0x2a;
  local_5a0[1] = ~kSuccess;
  local_5b0 = 2;
  for (local_5a8 = 0; local_5a8 < local_5b0; local_5a8 = local_5a8 + 1) {
    fmt::v5::format<char[9],int>
              ((char (*) [9])in_stack_fffffffffffff658,(int *)in_stack_fffffffffffff650);
    this_00 = local_5d0;
    std::__cxx11::string::operator=(local_28,this_00);
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::allocator();
    fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630),
               (allocator<char> *)in_stack_fffffffffffff628);
    std::allocator<char>::~allocator(&local_7e9);
    in_stack_fffffffffffff650 = (AssertHelper *)std::__cxx11::string::size();
    lVar4 = std::__cxx11::string::size();
    in_stack_fffffffffffff658 =
         (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
         (500 - ((long)&in_stack_fffffffffffff650->data_ + lVar4));
    paVar6 = &local_811;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_810,(ulong)in_stack_fffffffffffff658,'x',paVar6);
    std::allocator<char>::~allocator((allocator<char> *)&local_811);
    type = local_5a0[local_5a8];
    fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
              ((basic_string_view<char> *)
               CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
               in_stack_fffffffffffff618);
    message_01.size_ = uVar5;
    message_01.data_ = pcVar3;
    fmt::v5::anon_unknown_10::format_error_code
              ((buffer *)CONCAT17(uVar2,in_stack_fffffffffffff680),
               (int)((ulong)in_stack_fffffffffffff678 >> 0x20),message_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(type,in_stack_fffffffffffff648),in_stack_fffffffffffff640);
    std::operator+(in_stack_fffffffffffff628,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
    fmt::v5::to_string<char,500ul>(in_stack_fffffffffffff658);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffff638,
               (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630),
               in_stack_fffffffffffff628,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
    line = (int)((ulong)in_stack_fffffffffffff638 >> 0x20);
    std::__cxx11::string::~string(local_898);
    std::__cxx11::string::~string(local_858);
    std::__cxx11::string::~string(local_878);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_838);
    in_stack_fffffffffffff648 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff648);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff650);
      in_stack_fffffffffffff640 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x1127e8);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff650,type,(char *)in_stack_fffffffffffff640,line,
                 (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630));
      testing::internal::AssertHelper::operator=(this_01,(Message *)message_03);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
      testing::Message::~Message((Message *)0x112845);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11289d);
    local_8b0 = 500;
    in_stack_fffffffffffff638 = (char *)fmt::v5::internal::basic_buffer<char>::size(local_7e8);
    local_8c8 = in_stack_fffffffffffff638;
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              (in_stack_fffffffffffff638,
               (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630),
               (unsigned_long *)in_stack_fffffffffffff628,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
    in_stack_fffffffffffff637 = testing::AssertionResult::operator_cast_to_bool(&local_8c0);
    if (!(bool)in_stack_fffffffffffff637) {
      testing::Message::Message((Message *)in_stack_fffffffffffff650);
      in_stack_fffffffffffff628 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x112960);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff650,type,(char *)in_stack_fffffffffffff640,
                 (int)((ulong)in_stack_fffffffffffff638 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630));
      testing::internal::AssertHelper::operator=(this_01,(Message *)message_03);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
      testing::Message::~Message((Message *)0x1129bd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x112a15);
    fmt::v5::internal::basic_buffer<char>::resize
              ((basic_buffer<char> *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
               (size_t)in_stack_fffffffffffff618);
    std::__cxx11::string::operator+=(local_810,'x');
    in_stack_fffffffffffff624 = local_5a0[local_5a8];
    fmt::v5::basic_string_view<char>::basic_string_view<std::char_traits<char>>
              ((basic_string_view<char> *)
               CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
               in_stack_fffffffffffff618);
    message_02.size_ = uVar5;
    message_02.data_ = pcVar3;
    fmt::v5::anon_unknown_10::format_error_code
              ((buffer *)CONCAT17(uVar2,in_stack_fffffffffffff680),
               (int)((ulong)in_stack_fffffffffffff678 >> 0x20),message_02);
    fmt::v5::to_string<char,500ul>(in_stack_fffffffffffff658);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffff638,
               (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630),
               in_stack_fffffffffffff628,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
    std::__cxx11::string::~string(local_918);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8f8);
    in_stack_fffffffffffff620 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff620);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffff650);
      in_stack_fffffffffffff618 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x112b69);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffff650,type,(char *)in_stack_fffffffffffff640,
                 (int)((ulong)in_stack_fffffffffffff638 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffff637,in_stack_fffffffffffff630));
      testing::internal::AssertHelper::operator=(this_01,(Message *)message_03);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
      testing::Message::~Message((Message *)0x112bc4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x112c19);
    std::__cxx11::string::~string(local_810);
    fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620));
  }
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(FormatTest, FormatErrorCode) {
  std::string msg = "error 42", sep = ": ";
  {
    fmt::memory_buffer buffer;
    format_to(buffer, "garbage");
    fmt::format_error_code(buffer, 42, "test");
    EXPECT_EQ("test: " + msg, to_string(buffer));
  }
  {
    fmt::memory_buffer buffer;
    std::string prefix(
        fmt::inline_buffer_size - msg.size() - sep.size() + 1, 'x');
    fmt::format_error_code(buffer, 42, prefix);
    EXPECT_EQ(msg, to_string(buffer));
  }
  int codes[] = {42, -1};
  for (std::size_t i = 0, n = sizeof(codes) / sizeof(*codes); i < n; ++i) {
    // Test maximum buffer size.
    msg = fmt::format("error {}", codes[i]);
    fmt::memory_buffer buffer;
    std::string prefix(
        fmt::inline_buffer_size - msg.size() - sep.size(), 'x');
    fmt::format_error_code(buffer, codes[i], prefix);
    EXPECT_EQ(prefix + sep + msg, to_string(buffer));
    std::size_t size = fmt::inline_buffer_size;
    EXPECT_EQ(size, buffer.size());
    buffer.resize(0);
    // Test with a message that doesn't fit into the buffer.
    prefix += 'x';
    fmt::format_error_code(buffer, codes[i], prefix);
    EXPECT_EQ(msg, to_string(buffer));
  }
}